

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O3

vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
* anon_unknown.dwarf_1d9ed4d::GetInvTxfm2dParamList(void)

{
  int iVar1;
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  *extraout_RAX;
  vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
  *pvVar2;
  vector<std::tuple<unsigned_char,unsigned_char,int,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,int,double>>>
  *in_RDI;
  int s;
  ulong uVar3;
  long lVar4;
  int iVar5;
  tuple<unsigned_char,_unsigned_char,_int,_double> local_48;
  _Head_base<3UL,_double,_false> local_38;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  uVar3 = 0;
  do {
    iVar1 = (&(anonymous_namespace)::max_error_ls)[uVar3];
    local_38._M_head_impl = (double)(&(anonymous_namespace)::avg_error_ls)[uVar3];
    iVar5 = (uint)((0x18608UL >> (uVar3 & 0x3f) & 1) == 0) * 4 + 1;
    if ((0x61810UL >> (uVar3 & 0x3f) & 1) != 0) {
      iVar5 = 0;
    }
    lVar4 = 0;
    do {
      pvVar2 = (vector<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
                *)((ulong)(uint)(iVar5 << 6) + lVar4 * 4);
      if (*(int *)&pvVar2[0x88b2f].
                   super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_int,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish != 0) {
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl =
             (_Head_base<3UL,_double,_false>)(_Head_base<3UL,_double,_false>)local_38._M_head_impl;
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        _12_1_ = SUB81(uVar3,0);
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        _13_1_ = SUB81(lVar4,0);
        local_48.super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_int,_double>.
        super__Tuple_impl<1UL,_unsigned_char,_int,_double>.super__Tuple_impl<2UL,_int,_double>.
        super__Head_base<2UL,_int,_false>._M_head_impl = iVar1;
        std::
        vector<std::tuple<unsigned_char,unsigned_char,int,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,int,double>>>
        ::emplace_back<std::tuple<unsigned_char,unsigned_char,int,double>>(in_RDI,&local_48);
        pvVar2 = extraout_RAX;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 5);
  return pvVar2;
}

Assistant:

vector<AV1InvTxfm2dParam> GetInvTxfm2dParamList() {
  vector<AV1InvTxfm2dParam> param_list;
  for (int s = 0; s < TX_SIZES; ++s) {
    const int max_error = max_error_ls[s];
    const double avg_error = avg_error_ls[s];
    for (int t = 0; t < TX_TYPES; ++t) {
      const TxType tx_type = static_cast<TxType>(t);
      const TxSize tx_size = static_cast<TxSize>(s);
      if (libaom_test::IsTxSizeTypeValid(tx_size, tx_type)) {
        param_list.push_back(
            AV1InvTxfm2dParam(tx_type, tx_size, max_error, avg_error));
      }
    }
  }
  return param_list;
}